

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

void on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  uv_tcp_t *tcp;
  uv_loop_t *loop;
  uv_stream_t *unaff_RBX;
  uv_tcp_t *puVar2;
  uv_loop_t *puVar3;
  undefined8 uStack_28;
  code *pcStack_20;
  
  if (status == 0) {
    puVar3 = (uv_loop_t *)0xf8;
    pcStack_20 = (code *)0x1700f0;
    tcp = (uv_tcp_t *)malloc(0xf8);
    unaff_RBX = server;
    if (tcp == (uv_tcp_t *)0x0) goto LAB_00170142;
    puVar3 = server->loop;
    pcStack_20 = (code *)0x170109;
    puVar2 = tcp;
    iVar1 = uv_tcp_init_ex(puVar3,tcp,2);
    status = (int)puVar2;
    if (iVar1 != 0) goto LAB_00170147;
    pcStack_20 = (code *)0x170118;
    puVar2 = tcp;
    puVar3 = (uv_loop_t *)server;
    iVar1 = uv_accept(server,(uv_stream_t *)tcp);
    status = (int)puVar2;
    if (iVar1 == -0x10) {
      pcStack_20 = (code *)0x170127;
      uv_close((uv_handle_t *)server,(uv_close_cb)0x0);
      uv_close((uv_handle_t *)tcp,free);
      return;
    }
  }
  else {
    pcStack_20 = (code *)0x170142;
    on_connection_cold_1();
    puVar3 = (uv_loop_t *)server;
LAB_00170142:
    pcStack_20 = (code *)0x170147;
    on_connection_cold_4();
LAB_00170147:
    pcStack_20 = (code *)0x17014c;
    on_connection_cold_2();
  }
  pcStack_20 = on_connect;
  on_connection_cold_3();
  if (status == 0) {
    uv_close((uv_handle_t *)puVar3->pending_queue[0],(uv_close_cb)0x0);
    return;
  }
  uStack_28 = (void *)0x170166;
  on_connect_cold_1();
  uStack_28 = unaff_RBX;
  loop = uv_default_loop();
  puVar3 = loop;
  iVar1 = uv_tcp_init(loop,(uv_tcp_t *)&stack0xfffffffffffffee0);
  if (iVar1 == 0) {
    puVar3 = (uv_loop_t *)&stack0xfffffffffffffee0;
    iVar1 = uv_tcp_nodelay((uv_tcp_t *)puVar3,1);
    if (iVar1 != 0) goto LAB_00170216;
    puVar3 = (uv_loop_t *)&stack0xfffffffffffffee0;
    iVar1 = uv_tcp_keepalive((uv_tcp_t *)puVar3,1,0x3c);
    if (iVar1 != 0) goto LAB_0017021b;
    uv_close((uv_handle_t *)&stack0xfffffffffffffee0,(uv_close_cb)0x0);
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      loop = uv_default_loop();
      iVar1 = uv_loop_close(loop);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00170225;
    }
  }
  else {
    run_test_tcp_flags_cold_1();
LAB_00170216:
    run_test_tcp_flags_cold_2();
LAB_0017021b:
    loop = puVar3;
    run_test_tcp_flags_cold_3();
  }
  run_test_tcp_flags_cold_4();
LAB_00170225:
  run_test_tcp_flags_cold_5();
  iVar1 = uv_is_closing((uv_handle_t *)loop);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return;
}

Assistant:

static void on_connection(uv_stream_t* server, int status) {
  uv_tcp_t* conn;
  int r;

  if (!local_conn_accepted) {
    /* Accept the connection and close it.  Also and close the server. */
    ASSERT(status == 0);
    ASSERT((uv_stream_t*)&tcp_server == server);

    conn = malloc(sizeof(*conn));
    ASSERT(conn);
    r = uv_tcp_init(server->loop, conn);
    ASSERT(r == 0);

    r = uv_accept(server, (uv_stream_t*)conn);
    ASSERT(r == 0);

    uv_close((uv_handle_t*)conn, close_server_conn_cb);
    uv_close((uv_handle_t*)server, NULL);
    local_conn_accepted = 1;
  }
}